

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O2

bool libwebm::vttdemux::InitializeFiles(metadata_map_t *m)

{
  _Rb_tree_node_base *p_Var1;
  int iVar2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Self __tmp;
  
  p_Var3 = &(m->_M_t)._M_impl.super__Rb_tree_header;
  p_Var1 = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    p_Var4 = p_Var1;
    if ((_Rb_tree_header *)p_Var4 == p_Var3) goto LAB_0010ea7d;
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    iVar2 = fputs("WEBVTT\n",(FILE *)p_Var4[1]._M_left);
  } while (-1 < iVar2);
  puts("unable to initialize output file");
LAB_0010ea7d:
  return (_Rb_tree_header *)p_Var4 == p_Var3;
}

Assistant:

bool vttdemux::InitializeFiles(const metadata_map_t& m) {
  // Write the WebVTT header for each output file in the cache.

  typedef metadata_map_t::const_iterator iter_t;
  iter_t i = m.begin();
  const iter_t j = m.end();

  while (i != j) {
    const metadata_map_t::value_type& v = *i++;
    const MetadataInfo& info = v.second;
    FILE* const f = info.file;

    if (fputs("WEBVTT\n", f) < 0) {
      printf("unable to initialize output file\n");
      return false;
    }
  }

  return true;
}